

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O0

QMainWindowLayoutState * __thiscall
QMainWindowLayoutState::operator=(QMainWindowLayoutState *this,QMainWindowLayoutState *param_2)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  QMainWindowLayoutState *in_RDI;
  QDockAreaLayout *unaff_retaddr;
  QMainWindowLayoutState *pQVar2;
  
  uVar1 = *in_RSI;
  (in_RDI->rect).x1 = (Representation)(int)uVar1;
  (in_RDI->rect).y1 = (Representation)(int)((ulong)uVar1 >> 0x20);
  uVar1 = in_RSI[1];
  (in_RDI->rect).x2 = (Representation)(int)uVar1;
  (in_RDI->rect).y2 = (Representation)(int)((ulong)uVar1 >> 0x20);
  in_RDI->mainWindow = (QMainWindow *)in_RSI[2];
  pQVar2 = in_RDI;
  QToolBarAreaLayout::operator=((QToolBarAreaLayout *)unaff_retaddr,(QToolBarAreaLayout *)in_RDI);
  QDockAreaLayout::operator=(unaff_retaddr,(QDockAreaLayout *)pQVar2);
  return in_RDI;
}

Assistant:

class Q_AUTOTEST_EXPORT QMainWindowLayoutState
{
public:
    QRect rect;
    QMainWindow *mainWindow;

    QMainWindowLayoutState(QMainWindow *win);

#if QT_CONFIG(toolbar)
    QToolBarAreaLayout toolBarAreaLayout;
#endif

#if QT_CONFIG(dockwidget)
    QDockAreaLayout dockAreaLayout;
#else
    QLayoutItem *centralWidgetItem;
    QRect centralWidgetRect;
#endif

    void apply(bool animated);
    void deleteAllLayoutItems();
    void deleteCentralWidgetItem();

    QSize sizeHint() const;
    QSize minimumSize() const;
    bool fits() const;
    void fitLayout();

    QLayoutItem *itemAt(int index, int *x) const;
    QLayoutItem *takeAt(int index, int *x);
    QList<int> indexOf(QWidget *widget) const;
    QLayoutItem *item(const QList<int> &path);
    QRect itemRect(const QList<int> &path) const;
    QRect gapRect(const QList<int> &path) const; // ### get rid of this, use itemRect() instead

    bool contains(QWidget *widget) const;

    void setCentralWidget(QWidget *widget);
    QWidget *centralWidget() const;

    QList<int> gapIndex(QWidget *widget, const QPoint &pos) const;
    bool insertGap(const QList<int> &path, QLayoutItem *item);
    void remove(const QList<int> &path);
    void remove(QLayoutItem *item);
    void clear();
    bool isValid() const;

    QLayoutItem *plug(const QList<int> &path);
    QLayoutItem *unplug(const QList<int> &path, QMainWindowLayoutState *savedState = nullptr);

    void saveState(QDataStream &stream) const;
    bool checkFormat(QDataStream &stream);
    bool restoreState(QDataStream &stream, const QMainWindowLayoutState &oldState);
}